

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

void ma_spatializer_set_cone
               (ma_spatializer *pSpatializer,float innerAngleInRadians,float outerAngleInRadians,
               float outerGain)

{
  if (pSpatializer != (ma_spatializer *)0x0) {
    LOCK();
    pSpatializer->coneInnerAngleInRadians = innerAngleInRadians;
    UNLOCK();
    LOCK();
    pSpatializer->coneOuterAngleInRadians = outerAngleInRadians;
    UNLOCK();
    LOCK();
    pSpatializer->coneOuterGain = outerGain;
    UNLOCK();
  }
  return;
}

Assistant:

MA_API void ma_spatializer_set_cone(ma_spatializer* pSpatializer, float innerAngleInRadians, float outerAngleInRadians, float outerGain)
{
    if (pSpatializer == NULL) {
        return;
    }

    ma_atomic_exchange_f32(&pSpatializer->coneInnerAngleInRadians, innerAngleInRadians);
    ma_atomic_exchange_f32(&pSpatializer->coneOuterAngleInRadians, outerAngleInRadians);
    ma_atomic_exchange_f32(&pSpatializer->coneOuterGain,           outerGain);
}